

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ipc_messages.cpp
# Opt level: O0

int test_ipcmsg_summary_with_testres(ITesting *t)

{
  pointer *this;
  value_type pIVar1;
  bool bVar2;
  __type_conflict4 _Var3;
  int iVar4;
  element_type *peVar5;
  IPCTestResults *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar6;
  size_type sVar7;
  size_type sVar8;
  reference ppIVar9;
  size_t sVar10;
  AssertError *this_01;
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  *pvVar11;
  const_reference pvVar12;
  const_reference pvVar13;
  kTRContinueMode tr_temp_res_13;
  kTRContinueMode tr_temp_res_12;
  kTRContinueMode tr_temp_res_11;
  kTRContinueMode tr_temp_res_10;
  value_type *assertErrorRef;
  value_type *assertErrorIn;
  undefined1 local_218 [4];
  kTRContinueMode tr_temp_res_9;
  Ref testResultIn;
  kTRContinueMode tr_temp_res_8;
  value_type first;
  kTRContinueMode tr_temp_res_7;
  kTRContinueMode tr_temp_res_6;
  kTRContinueMode tr_temp_res_5;
  kTRContinueMode tr_temp_res_4;
  kTRContinueMode tr_temp_res_3;
  kTRContinueMode tr_temp_res_2;
  IPCBinaryDecoder decoder;
  IPCResultSummary resultSummaryIn;
  UTest_IPC_VectorReader vectorReader;
  kTRContinueMode tr_temp_res_1;
  undefined1 local_168 [4];
  kTRContinueMode tr_temp_res;
  IPCBinaryEncoder encoder;
  IPCBufferedWriter bufferedWriter;
  UTest_IPC_VectorWriter vectorWriter;
  IPCTestResults *testResultsOut;
  string local_100 [32];
  undefined1 local_e0 [8];
  Ref tr;
  string local_c8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  AssertError assertError;
  IPCResultSummary resultSummaryOut;
  ITesting *t_local;
  
  resultSummaryOut.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)t;
  gnilk::IPCResultSummary::IPCResultSummary
            ((IPCResultSummary *)
             &assertError.assertErrors.
              super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  resultSummaryOut.super_IPCDeserializer.super_IPCObject._vptr_IPCObject._0_4_ = 1;
  resultSummaryOut.super_IPCDeserializer.super_IPCObject._vptr_IPCObject._4_4_ = 2;
  resultSummaryOut.testsExecuted = 0;
  resultSummaryOut.testsFailed = 0x40080000;
  trun::AssertError::AssertError((AssertError *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"your hamster is a cat",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"my_fine_file.cpp",
             (allocator<char> *)
             ((long)&tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  trun::AssertError::Add((AssertError *)local_70,kAssert_Error,0x1267,&local_90,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"my_test_case",(allocator<char> *)((long)&testResultsOut + 7));
  trun::TestResult::Create((string *)local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&testResultsOut + 7));
  peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_e0);
  trun::TestResult::SetResult(peVar5,kTestResult_Pass);
  peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_e0);
  trun::TestResult::SetAssertError(peVar5,(AssertError *)local_70);
  peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_e0);
  trun::TestResult::SetNumberOfAsserts(peVar5,1);
  this_00 = (IPCTestResults *)operator_new(0x60);
  gnilk::IPCTestResults::IPCTestResults(this_00,(Ref *)local_e0);
  vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this_00->symbolName,"my_test_case");
  std::vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>::push_back
            ((vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_> *)
             &resultSummaryOut.durationSec,
             (value_type *)
             &vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  this = &bufferedWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  UTest_IPC_VectorWriter::UTest_IPC_VectorWriter((UTest_IPC_VectorWriter *)this);
  gnilk::IPCBufferedWriter::IPCBufferedWriter
            ((IPCBufferedWriter *)&encoder.writer,(IPCWriter *)this);
  gnilk::IPCBinaryEncoder::IPCBinaryEncoder
            ((IPCBinaryEncoder *)local_168,(IPCWriter *)&encoder.writer);
  bVar2 = gnilk::IPCResultSummary::Marshal
                    ((IPCResultSummary *)
                     &assertError.assertErrors.
                      super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(IPCEncoderBase *)local_168
                    );
  if ((bVar2) ||
     (iVar4 = (*(code *)resultSummaryOut.testResults.
                        super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                        (0x73,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                         ,"resultSummaryOut.Marshal(encoder)"), iVar4 != 0)) {
    gnilk::IPCBufferedWriter::Flush((IPCBufferedWriter *)&encoder.writer);
    pvVar6 = UTest_IPC_VectorWriter::Data
                       ((UTest_IPC_VectorWriter *)
                        &bufferedWriter.data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(pvVar6);
    if ((bVar2) &&
       (iVar4 = (*(code *)resultSummaryOut.testResults.
                          super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                          (0x77,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                           ,"!vectorWriter.Data().empty()"), iVar4 == 0)) {
      t_local._4_4_ = 0x10;
    }
    else {
      pvVar6 = UTest_IPC_VectorWriter::Data
                         ((UTest_IPC_VectorWriter *)
                          &bufferedWriter.data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      UTest_IPC_VectorReader::UTest_IPC_VectorReader
                ((UTest_IPC_VectorReader *)
                 &resultSummaryIn.testResults.
                  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar6);
      gnilk::IPCResultSummary::IPCResultSummary((IPCResultSummary *)&decoder.deserializer);
      gnilk::IPCBinaryDecoder::IPCBinaryDecoder
                ((IPCBinaryDecoder *)&tr_temp_res_3,
                 (IPCReader *)
                 &resultSummaryIn.testResults.
                  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (IPCDeserializer *)&resultSummaryIn);
      bVar2 = gnilk::IPCBinaryDecoder::Process((IPCBinaryDecoder *)&tr_temp_res_3);
      if ((bVar2) ||
         (iVar4 = (*(code *)resultSummaryOut.testResults.
                            super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                            (0x7f,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                             ,"decoder.Process()"), iVar4 != 0)) {
        bVar2 = gnilk::IPCBinaryDecoder::Available((IPCBinaryDecoder *)&tr_temp_res_3);
        if ((bVar2) &&
           (iVar4 = (*(code *)resultSummaryOut.testResults.
                              super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                              (0x80,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                               ,"decoder.Available() == false"), iVar4 == 0)) {
          t_local._4_4_ = 0x10;
        }
        else if (((int)resultSummaryIn.super_IPCDeserializer.super_IPCObject._vptr_IPCObject ==
                  (int)resultSummaryOut.super_IPCDeserializer.super_IPCObject._vptr_IPCObject) ||
                (iVar4 = (*(code *)resultSummaryOut.testResults.
                                   super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                                   (0x83,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                    ,
                                    "resultSummaryIn.testsExecuted == resultSummaryOut.testsExecuted"
                                   ), iVar4 != 0)) {
          if ((resultSummaryIn.super_IPCDeserializer.super_IPCObject._vptr_IPCObject._4_4_ ==
               resultSummaryOut.super_IPCDeserializer.super_IPCObject._vptr_IPCObject._4_4_) ||
             (iVar4 = (*(code *)resultSummaryOut.testResults.
                                super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                                (0x84,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                 ,"resultSummaryIn.testsFailed == resultSummaryOut.testsFailed"),
             iVar4 != 0)) {
            if ((((double)resultSummaryIn._16_8_ == (double)resultSummaryOut._16_8_) &&
                (!NAN((double)resultSummaryIn._16_8_) && !NAN((double)resultSummaryOut._16_8_))) ||
               (iVar4 = (*(code *)resultSummaryOut.testResults.
                                  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                                  (0x85,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                   ,"resultSummaryIn.durationSec == resultSummaryOut.durationSec"),
               iVar4 != 0)) {
              sVar7 = std::vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                      ::size((vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                              *)&resultSummaryIn.durationSec);
              sVar8 = std::vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                      ::size((vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                              *)&resultSummaryOut.durationSec);
              if ((sVar7 == sVar8) ||
                 (iVar4 = (*(code *)resultSummaryOut.testResults.
                                    super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                                    (0x86,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                     ,
                                     "resultSummaryIn.testResults.size() == resultSummaryOut.testResults.size()"
                                    ), iVar4 != 0)) {
                ppIVar9 = std::
                          vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                          ::operator[]((vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                        *)&resultSummaryIn.durationSec,0);
                pIVar1 = *ppIVar9;
                _Var3 = std::operator==(&pIVar1->symbolName,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(vectorWriter.data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                           0x10));
                if ((_Var3) ||
                   (testResultIn.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_ =
                         (*(code *)resultSummaryOut.testResults.
                                   super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                                   (0x88,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                    ,"first->symbolName == testResultsOut->symbolName"),
                   testResultIn.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._4_4_ != 0)) {
                  std::shared_ptr<trun::TestResult>::shared_ptr
                            ((shared_ptr<trun::TestResult> *)local_218,&pIVar1->testResult);
                  peVar5 = std::
                           __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_218);
                  sVar10 = trun::TestResult::Asserts(peVar5);
                  if ((sVar10 == 1) ||
                     (iVar4 = (*(code *)resultSummaryOut.testResults.
                                        super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                                        (0x8a,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                         ,"testResultIn->Asserts() == 1"), iVar4 != 0)) {
                    peVar5 = std::
                             __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_218);
                    this_01 = trun::TestResult::AssertError(peVar5);
                    pvVar11 = trun::AssertError::Errors(this_01);
                    pvVar12 = std::
                              vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                              ::front(pvVar11);
                    pvVar11 = trun::AssertError::Errors((AssertError *)local_70);
                    pvVar13 = std::
                              vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                              ::front(pvVar11);
                    if ((pvVar12->line == pvVar13->line) ||
                       (iVar4 = (*(code *)resultSummaryOut.testResults.
                                          super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                                          (0x8e,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                           ,"assertErrorIn.line == assertErrorRef.line"), iVar4 != 0
                       )) {
                      _Var3 = std::operator==(&pvVar12->file,&pvVar13->file);
                      if ((_Var3) ||
                         (iVar4 = (*(code *)resultSummaryOut.testResults.
                                            super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                                            (0x8f,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                             ,"assertErrorIn.file == assertErrorRef.file"),
                         iVar4 != 0)) {
                        _Var3 = std::operator==(&pvVar12->message,&pvVar13->message);
                        if ((_Var3) ||
                           (iVar4 = (*(code *)resultSummaryOut.testResults.
                                              super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage[6])
                                              (0x90,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                               ,"assertErrorIn.message == assertErrorRef.message"),
                           iVar4 != 0)) {
                          if ((pvVar12->assertClass == pvVar13->assertClass) ||
                             (iVar4 = (*(code *)resultSummaryOut.testResults.
                                                super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                [6])(0x91,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                                  ,
                                                  "assertErrorIn.assertClass == assertErrorRef.assertClass"
                                                  ), iVar4 != 0)) {
                            t_local._4_4_ = 0;
                          }
                          else {
                            t_local._4_4_ = 0x10;
                          }
                        }
                        else {
                          t_local._4_4_ = 0x10;
                        }
                      }
                      else {
                        t_local._4_4_ = 0x10;
                      }
                    }
                    else {
                      t_local._4_4_ = 0x10;
                    }
                  }
                  else {
                    t_local._4_4_ = 0x10;
                  }
                  std::shared_ptr<trun::TestResult>::~shared_ptr
                            ((shared_ptr<trun::TestResult> *)local_218);
                }
                else {
                  t_local._4_4_ = 0x10;
                }
              }
              else {
                t_local._4_4_ = 0x10;
              }
            }
            else {
              t_local._4_4_ = 0x10;
            }
          }
          else {
            t_local._4_4_ = 0x10;
          }
        }
        else {
          t_local._4_4_ = 0x10;
        }
      }
      else {
        t_local._4_4_ = 0x10;
      }
      gnilk::IPCResultSummary::~IPCResultSummary((IPCResultSummary *)&decoder.deserializer);
    }
  }
  else {
    t_local._4_4_ = 0x10;
  }
  gnilk::IPCBufferedWriter::~IPCBufferedWriter((IPCBufferedWriter *)&encoder.writer);
  UTest_IPC_VectorWriter::~UTest_IPC_VectorWriter
            ((UTest_IPC_VectorWriter *)
             &bufferedWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::shared_ptr<trun::TestResult>::~shared_ptr((shared_ptr<trun::TestResult> *)local_e0);
  trun::AssertError::~AssertError((AssertError *)local_70);
  gnilk::IPCResultSummary::~IPCResultSummary
            ((IPCResultSummary *)
             &assertError.assertErrors.
              super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return t_local._4_4_;
}

Assistant:

DLL_EXPORT int test_ipcmsg_summary_with_testres(ITesting *t) {
    gnilk::IPCResultSummary resultSummaryOut;
    resultSummaryOut.testsExecuted = 1;
    resultSummaryOut.testsFailed = 2;
    resultSummaryOut.durationSec = 3.0;

    // Create a fake assert error
    trun::AssertError assertError;

    assertError.Add(trun::AssertError::kAssert_Error, 4711, "your hamster is a cat", "my_fine_file.cpp");

    auto tr = trun::TestResult::Create("my_test_case");
    tr->SetResult(trun::kTestResult::kTestResult_Pass);
    tr->SetAssertError(assertError);
    tr->SetNumberOfAsserts(1);  // Must be done explicitly..

    auto testResultsOut = new gnilk::IPCTestResults(tr);
    testResultsOut->symbolName = "my_test_case";
    resultSummaryOut.testResults.push_back(testResultsOut);


    UTest_IPC_VectorWriter vectorWriter;
    gnilk::IPCBufferedWriter bufferedWriter(vectorWriter);
    gnilk::IPCBinaryEncoder encoder(bufferedWriter);

    // Serialize
    TR_ASSERT(t, resultSummaryOut.Marshal(encoder));

    // Flush data - this will do the actual writing to the underlying writer
    bufferedWriter.Flush();
    TR_ASSERT(t, !vectorWriter.Data().empty());

    // Deserialize again
    UTest_IPC_VectorReader vectorReader(vectorWriter.Data());
    gnilk::IPCResultSummary resultSummaryIn;
    gnilk::IPCBinaryDecoder decoder(vectorReader, resultSummaryIn);

    // Deserialize
    TR_ASSERT(t, decoder.Process());
    TR_ASSERT(t, decoder.Available() == false);

    // Make sure we have everything
    TR_ASSERT(t, resultSummaryIn.testsExecuted == resultSummaryOut.testsExecuted);
    TR_ASSERT(t, resultSummaryIn.testsFailed == resultSummaryOut.testsFailed);
    TR_ASSERT(t, resultSummaryIn.durationSec == resultSummaryOut.durationSec);
    TR_ASSERT(t, resultSummaryIn.testResults.size() == resultSummaryOut.testResults.size());
    auto first = resultSummaryIn.testResults[0];
    TR_ASSERT(t, first->symbolName == testResultsOut->symbolName);
    auto testResultIn = first->testResult;
    TR_ASSERT(t, testResultIn->Asserts() == 1);
    // Verify the propagation of the assert error from above
    auto &assertErrorIn = testResultIn->AssertError().Errors().front();
    auto &assertErrorRef = assertError.Errors().front();
    TR_ASSERT(t, assertErrorIn.line == assertErrorRef.line);
    TR_ASSERT(t, assertErrorIn.file == assertErrorRef.file);
    TR_ASSERT(t, assertErrorIn.message == assertErrorRef.message);
    TR_ASSERT(t, assertErrorIn.assertClass == assertErrorRef.assertClass);


    return kTR_Pass;

}